

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O1

bool __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadMultiLineText
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char **a_pData,
          char **a_pVal,char *a_pTagName,bool a_bAllowBlankLinesInComment)

{
  char *pcVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  byte *pbVar8;
  size_t sVar9;
  char local_51;
  char *local_50;
  
  pcVar6 = *a_pData;
  *a_pVal = pcVar6;
  local_51 = **a_pData;
  pcVar5 = pcVar6;
  do {
    while (local_50 = pcVar5, a_pTagName != (char *)0x0) {
LAB_00181000:
      pcVar6 = *a_pData;
      sVar9 = 0;
      while ((0xd < (byte)pcVar6[sVar9] || ((0x2401U >> ((byte)pcVar6[sVar9] & 0x1f) & 1) == 0))) {
        *a_pData = pcVar6 + sVar9 + 1;
        sVar9 = sVar9 + 1;
      }
      if (local_50 < pcVar6) {
        memmove(local_50,pcVar6,sVar9);
        local_50[sVar9] = '\0';
      }
      local_51 = **a_pData;
      **a_pData = '\0';
      if (((a_pTagName != (char *)0x0) &&
          (bVar2 = SI_GenericNoCase<char>::operator()
                             ((SI_GenericNoCase<char> *)
                              &CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::
                               IsLess(char_const*,char_const*)::isLess,local_50,a_pTagName), !bVar2)
          ) && (bVar2 = SI_GenericNoCase<char>::operator()
                                  ((SI_GenericNoCase<char> *)
                                   &CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::
                                    IsLess(char_const*,char_const*)::isLess,a_pTagName,local_50),
               !bVar2)) goto LAB_001810e5;
      if (local_51 == '\0') {
        return true;
      }
      pcVar5 = *a_pData;
      *pcVar5 = local_51;
      pcVar1 = *a_pData;
      lVar3 = 1;
      if (*pcVar1 == '\r') {
        lVar3 = (ulong)(pcVar1[1] == '\n') + 1;
      }
      *a_pData = pcVar1 + lVar3;
      local_50[(long)pcVar5 - (long)pcVar6] = '\n';
      pcVar6 = local_50 + ((long)pcVar5 - (long)pcVar6) + 1;
      pcVar5 = pcVar6;
    }
    pbVar8 = (byte *)*a_pData;
    local_50 = pcVar6;
    if ((*pbVar8 == 0x23) || (*pbVar8 == 0x3b)) goto LAB_00181000;
    local_50 = pcVar5;
    if (!a_bAllowBlankLinesInComment) break;
    sVar9 = 0;
    while( true ) {
      uVar4 = (ulong)*pbVar8;
      if (0x3b < uVar4) break;
      lVar3 = 1;
      iVar7 = (int)sVar9;
      if ((0x2400UL >> (uVar4 & 0x3f) & 1) == 0) {
        if ((0x100000200U >> (uVar4 & 0x3f) & 1) == 0) {
          if ((0x800000800000000U >> (uVar4 & 0x3f) & 1) != 0) {
            if (0 < iVar7) {
              memset(pcVar6,10,sVar9);
              pcVar6 = pcVar6 + (ulong)(iVar7 - 1) + 1;
            }
            *a_pData = (char *)pbVar8;
            bVar2 = true;
            goto LAB_00180fee;
          }
          break;
        }
      }
      else {
        sVar9 = (size_t)(iVar7 + 1);
        if (*pbVar8 == 0xd) {
          lVar3 = (ulong)(pbVar8[1] == 10) + 1;
        }
      }
      pbVar8 = pbVar8 + lVar3;
    }
    bVar2 = false;
LAB_00180fee:
    local_50 = pcVar6;
  } while (bVar2);
LAB_001810e5:
  if (*a_pVal == *a_pData) {
    *a_pVal = (char *)0x0;
    bVar2 = false;
  }
  else {
    local_50[-1] = '\0';
    bVar2 = true;
    if (local_51 != '\0' && a_pTagName != (char *)0x0) {
      **a_pData = local_51;
      pcVar6 = *a_pData;
      lVar3 = 1;
      if (*pcVar6 == '\r') {
        lVar3 = (ulong)(pcVar6[1] == '\n') + 1;
      }
      *a_pData = pcVar6 + lVar3;
    }
  }
  return bVar2;
}

Assistant:

bool CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::LoadMultiLineText(SI_CHAR *&a_pData, const SI_CHAR *&a_pVal,
																		   const SI_CHAR *a_pTagName,
																		   bool a_bAllowBlankLinesInComment) const {
	// we modify this data to strip all newlines down to a single '\n'
	// character. This means that on Windows we need to strip out some
	// characters which will make the data shorter.
	// i.e.  LINE1-LINE1\r\nLINE2-LINE2\0 will become
	//       LINE1-LINE1\nLINE2-LINE2\0
	// The pDataLine entry is the pointer to the location in memory that
	// the current line needs to start to run following the existing one.
	// This may be the same as pCurrLine in which case no move is needed.
	SI_CHAR *pDataLine = a_pData;
	SI_CHAR *pCurrLine;

	// value starts at the current line
	a_pVal = a_pData;

	// find the end tag. This tag must start in column 1 and be
	// followed by a newline. No whitespace removal is done while
	// searching for this tag.
	SI_CHAR cEndOfLineChar = *a_pData;
	for (;;) {
		// if we are loading comments then we need a comment character as
		// the first character on every line
		if (!a_pTagName && !IsComment(*a_pData)) {
			// if we aren't allowing blank lines then we're done
			if (!a_bAllowBlankLinesInComment) {
				break;
			}

			// if we are allowing blank lines then we only include them
			// in this comment if another comment follows, so read ahead
			// to find out.
			SI_CHAR *pCurr = a_pData;
			int nNewLines = 0;
			while (IsSpace(*pCurr)) {
				if (IsNewLineChar(*pCurr)) {
					++nNewLines;
					SkipNewLine(pCurr);
				} else {
					++pCurr;
				}
			}

			// we have a comment, add the blank lines to the output
			// and continue processing from here
			if (IsComment(*pCurr)) {
				for (; nNewLines > 0; --nNewLines) *pDataLine++ = '\n';
				a_pData = pCurr;
				continue;
			}

			// the comment ends here
			break;
		}

		// find the end of this line
		pCurrLine = a_pData;
		while (*a_pData && !IsNewLineChar(*a_pData)) ++a_pData;

		// move this line down to the location that it should be if necessary
		if (pDataLine < pCurrLine) {
			size_t nLen = (size_t)(a_pData - pCurrLine);
			memmove(pDataLine, pCurrLine, nLen * sizeof(SI_CHAR));
			pDataLine[nLen] = '\0';
		}

		// end the line with a NULL
		cEndOfLineChar = *a_pData;
		*a_pData = 0;

		// if are looking for a tag then do the check now. This is done before
		// checking for end of the data, so that if we have the tag at the end
		// of the data then the tag is removed correctly.
		if (a_pTagName && (!IsLess(pDataLine, a_pTagName) && !IsLess(a_pTagName, pDataLine))) {
			break;
		}

		// if we are at the end of the data then we just automatically end
		// this entry and return the current data.
		if (!cEndOfLineChar) {
			return true;
		}

		// otherwise we need to process this newline to ensure that it consists
		// of just a single \n character.
		pDataLine += (a_pData - pCurrLine);
		*a_pData = cEndOfLineChar;
		SkipNewLine(a_pData);
		*pDataLine++ = '\n';
	}

	// if we didn't find a comment at all then return false
	if (a_pVal == a_pData) {
		a_pVal = NULL;
		return false;
	}

	// the data (which ends at the end of the last line) needs to be
	// null-terminated BEFORE before the newline character(s). If the
	// user wants a new line in the multi-line data then they need to
	// add an empty line before the tag.
	*--pDataLine = '\0';

	// if looking for a tag and if we aren't at the end of the data,
	// then move a_pData to the start of the next line.
	if (a_pTagName && cEndOfLineChar) {
		SI_ASSERT(IsNewLineChar(cEndOfLineChar));
		*a_pData = cEndOfLineChar;
		SkipNewLine(a_pData);
	}

	return true;
}